

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall gl4cts::CopyImage::ExceedingBoundariesTest::clean(ExceedingBoundariesTest *this)

{
  reference pvVar1;
  testCase *test_case;
  ExceedingBoundariesTest *this_local;
  
  pvVar1 = std::
           vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
           ::operator[](&this->m_test_cases,(ulong)this->m_test_case_index);
  Utils::deleteTexture((this->super_TestCase).m_context,pvVar1->m_tex_target,this->m_dst_tex_name);
  Utils::deleteTexture((this->super_TestCase).m_context,pvVar1->m_tex_target,this->m_src_tex_name);
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  return;
}

Assistant:

void ExceedingBoundariesTest::clean()
{
	const testCase& test_case = m_test_cases[m_test_case_index];

	/* Clean textures and buffers. Errors ignored */
	Utils::deleteTexture(m_context, test_case.m_tex_target, m_dst_tex_name);
	Utils::deleteTexture(m_context, test_case.m_tex_target, m_src_tex_name);

	m_dst_tex_name = 0;
	m_src_tex_name = 0;
}